

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBlockCommand.cxx
# Opt level: O3

bool cmBlockCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *args,cmExecutionStatus *status)

{
  pointer ppVar1;
  pointer ppVar2;
  cmMakefile *m;
  bool bVar3;
  int iVar4;
  tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_> tVar5;
  PolicyPushPop *this;
  VariablePushPop *this_00;
  offset_in_Arguments_to_MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_RCX;
  size_type __rlen;
  ulong uVar6;
  undefined4 uVar7;
  undefined8 unaff_R12;
  pointer __p;
  ulong uVar8;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  static_string_view name;
  static_string_view name_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unrecognizedArguments;
  Arguments parsedArgs;
  __uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> local_190;
  undefined4 local_184;
  __uniq_ptr_impl<cmMakefile::PolicyPushPop,_std::default_delete<cmMakefile::PolicyPushPop>_>
  *local_180;
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [24];
  _Any_data _Stack_120;
  _Manager_type p_Stack_110;
  _Invoker_type local_108;
  undefined1 auStack_100 [24];
  _Manager_type local_e8;
  pointer ppStack_e0;
  pointer local_d8;
  pointer ppStack_d0;
  undefined1 local_c8 [16];
  _Base_ptr local_b8;
  _Base_ptr local_b0;
  _Base_ptr local_a8;
  size_t local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  char local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  _Head_base<0UL,_cmMakefile::PolicyPushPop_*,_false> local_60;
  _Manager_type local_58;
  undefined1 local_50 [32];
  
  if ((cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar4 = __cxa_guard_acquire(&cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar4 != 0)) {
    local_d8 = (pointer)0x0;
    ppStack_d0 = (pointer)0x0;
    local_e8 = (_Manager_type)0x0;
    ppStack_e0 = (pointer)0x0;
    auStack_100._8_8_ = 0;
    auStack_100._16_8_ = 0;
    local_108 = (_Invoker_type)0x0;
    auStack_100._0_8_ = (void *)0x0;
    _Stack_120._8_8_ = 0;
    p_Stack_110 = (_Manager_type)0x0;
    local_138._16_8_ = (pointer)0x0;
    _Stack_120._M_unused._M_object = (void *)0x0;
    local_138._0_8_ = (ActionMap *)0x0;
    local_138._8_8_ = (pointer)0x0;
    name.super_string_view._M_str = "SCOPE_FOR";
    name.super_string_view._M_len = 9;
    cmArgumentParser<cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::
    Bind<std::optional<ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((cmArgumentParser<cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_138,name,in_RCX);
    name_00.super_string_view._M_str = "PROPAGATE";
    name_00.super_string_view._M_len = 9;
    cmArgumentParser<cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::
    Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((cmArgumentParser<cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_138,name_00,in_RCX);
    ArgumentParser::ActionMap::ActionMap
              ((ActionMap *)&cmBlockCommand::parser,(ActionMap *)local_138);
    ArgumentParser::Base::~Base((Base *)local_138);
    __cxa_atexit(ArgumentParser::Base::~Base,&cmBlockCommand::parser,&__dso_handle);
    __cxa_guard_release(&cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  local_138._16_8_ = local_158;
  local_158._0_8_ = (pointer)0x0;
  local_158._8_8_ = (pointer)0x0;
  local_158._16_8_ = (pointer)0x0;
  local_b0 = (_Base_ptr)(local_c8 + 8);
  local_c8._8_4_ = _S_red;
  local_b8 = (_Base_ptr)0x0;
  local_a0 = 0;
  local_80 = '\0';
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138._0_8_ = &cmBlockCommand::parser;
  local_138._8_8_ = local_c8;
  _Stack_120._8_8_ = 0;
  p_Stack_110 = (_Manager_type)0x0;
  local_108 = (_Invoker_type)0x0;
  auStack_100._0_8_ = (void *)0x0;
  auStack_100._8_8_ = 0;
  auStack_100._16_8_ = 0;
  local_e8 = (_Manager_type)0x0;
  ppStack_e0 = (pointer)0x0;
  local_d8 = (pointer)((ulong)local_d8 & 0xffffffffffffff00);
  _Stack_120._M_unused._0_8_ = (undefined8)local_138._8_8_;
  local_a8 = local_b0;
  ArgumentParser::Instance::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((Instance *)local_138,args,0);
  if (local_e8 != (_Manager_type)0x0) {
    (*local_e8)((_Any_data *)(auStack_100 + 8),(_Any_data *)(auStack_100 + 8),__destroy_functor);
  }
  if (local_158._0_8_ == local_158._8_8_) {
    bVar3 = ArgumentParser::ParseResult::MaybeReportError((ParseResult *)local_c8,status->Makefile);
    if (bVar3) {
      cmSystemTools::s_FatalErrorOccurred = true;
    }
    else {
      if (local_80 == '\x01') {
        uVar8 = 0;
        if (local_98.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_98.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            ppVar1 = (pointer)((local_98.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
            ppVar2 = (pointer)(local_98.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
            if (ppVar2 == (pointer)0x8) {
              uVar6 = 2;
              if (*(long *)&(((map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&ppVar1->first)->_M_t)._M_impl != 0x53454943494c4f50) {
LAB_0037681c:
                local_138._0_8_ = (ActionMap *)0x1d;
                local_138._8_8_ = "SCOPE_FOR unsupported scope \"";
                p_Stack_110 = (_Manager_type)local_50;
                local_60._M_head_impl = (PolicyPushPop *)0x1;
                local_50[0] = '\"';
                _Stack_120._8_8_ = 1;
                views_00._M_len = 3;
                views_00._M_array = (iterator)local_138;
                local_138._16_8_ = ppVar2;
                _Stack_120._M_unused._0_8_ = (undefined8)ppVar1;
                local_58 = p_Stack_110;
                cmCatViews_abi_cxx11_((string *)local_178,views_00);
                std::__cxx11::string::_M_assign((string *)&status->Error);
                goto LAB_00376500;
              }
            }
            else if ((ppVar2 != (pointer)0x9) ||
                    (uVar6 = 1,
                    (char)(((map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&ppVar1->first)->_M_t)._M_impl.super__Rb_tree_header._M_header.
                          _M_color != 0x53 ||
                    *(long *)&(((map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&ppVar1->first)->_M_t)._M_impl != 0x454c424149524156))
            goto LAB_0037681c;
            uVar8 = uVar8 | uVar6;
            local_98.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_98.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
          } while (local_98.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start !=
                   local_98.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
          if ((uVar8 & 1) != 0) goto LAB_00376646;
        }
        if (local_78.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_78.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_138._0_8_ = (ActionMap *)(local_138 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_138,
                     "PROPAGATE cannot be specified without a new scope for VARIABLES","");
          std::__cxx11::string::_M_assign((string *)&status->Error);
          local_178._16_8_ = local_138._16_8_;
          local_178._0_8_ = local_138._0_8_;
          if ((ActionMap *)local_138._0_8_ != (ActionMap *)(local_138 + 0x10)) goto LAB_00376513;
          goto LAB_0037651b;
        }
        uVar7 = (undefined4)CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
      }
      else {
        uVar8 = 3;
LAB_00376646:
        uVar7 = 0;
      }
      m = status->Makefile;
      tVar5.super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
      super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
           operator_new(0xd0);
      local_184 = uVar7;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_138,&local_78);
      *(long **)((long)tVar5.
                       super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                       .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 8) =
           (long *)((long)tVar5.
                          super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                          .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x18);
      *(long *)((long)tVar5.
                      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                      .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x10) = 0;
      *(undefined1 *)
       ((long)tVar5.
              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
              super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x18) = 0;
      *(long **)((long)tVar5.
                       super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                       .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x28) =
           (long *)((long)tVar5.
                          super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                          .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x38);
      *(long *)((long)tVar5.
                      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                      .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x30) = 0;
      *(undefined1 *)
       ((long)tVar5.
              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
              super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x38) = 0;
      *(long *)((long)tVar5.
                      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                      .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x48) = 0;
      *(undefined1 *)
       ((long)tVar5.
              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
              super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x70) = 0;
      *(long *)((long)tVar5.
                      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                      .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x78) = 0;
      *(long *)((long)tVar5.
                      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                      .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x80) = 0;
      *(long *)((long)tVar5.
                      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                      .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x88) = 0;
      *(undefined4 *)
       ((long)tVar5.
              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
              super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x90) = 1;
      *(undefined ***)
       tVar5.super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
       super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
           &PTR__cmBlockFunctionBlocker_0094f2d8;
      *(cmMakefile **)
       ((long)tVar5.
              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
              super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x98) = m;
      *(ulong *)((long)tVar5.
                       super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                       .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xa0) =
           uVar8;
      local_180 = (__uniq_ptr_impl<cmMakefile::PolicyPushPop,_std::default_delete<cmMakefile::PolicyPushPop>_>
                   *)((long)tVar5.
                            super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                            .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xa8);
      *(long *)((long)tVar5.
                      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                      .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xa8) = 0;
      *(long *)((long)tVar5.
                      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                      .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xb0) = 0;
      if ((uVar8 & 2) != 0) {
        this = (PolicyPushPop *)operator_new(8);
        cmMakefile::PolicyPushPop::PolicyPushPop(this,m);
        local_60._M_head_impl = (PolicyPushPop *)0x0;
        std::
        __uniq_ptr_impl<cmMakefile::PolicyPushPop,_std::default_delete<cmMakefile::PolicyPushPop>_>
        ::reset(local_180,this);
        std::unique_ptr<cmMakefile::PolicyPushPop,_std::default_delete<cmMakefile::PolicyPushPop>_>
        ::~unique_ptr((unique_ptr<cmMakefile::PolicyPushPop,_std::default_delete<cmMakefile::PolicyPushPop>_>
                       *)&local_60);
      }
      if ((char)local_184 == '\0') {
        this_00 = (VariablePushPop *)operator_new(8);
        cmMakefile::VariablePushPop::VariablePushPop(this_00,m);
        local_60._M_head_impl = (PolicyPushPop *)0x0;
        std::
        __uniq_ptr_impl<cmMakefile::VariablePushPop,_std::default_delete<cmMakefile::VariablePushPop>_>
        ::reset((__uniq_ptr_impl<cmMakefile::VariablePushPop,_std::default_delete<cmMakefile::VariablePushPop>_>
                 *)((long)tVar5.
                          super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                          .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xb0),
                this_00);
        std::
        unique_ptr<cmMakefile::VariablePushPop,_std::default_delete<cmMakefile::VariablePushPop>_>::
        ~unique_ptr((unique_ptr<cmMakefile::VariablePushPop,_std::default_delete<cmMakefile::VariablePushPop>_>
                     *)&local_60);
      }
      *(undefined8 *)
       ((long)tVar5.
              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
              super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xb8) =
           local_138._0_8_;
      *(undefined8 *)
       ((long)tVar5.
              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
              super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xc0) =
           local_138._8_8_;
      *(undefined8 *)
       ((long)tVar5.
              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
              super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 200) =
           local_138._16_8_;
      local_138._0_8_ = (ActionMap *)0x0;
      local_138._8_8_ = (pointer)0x0;
      local_138._16_8_ = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_138);
      local_190._M_t.
      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
      super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
           (tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
           (tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
           tVar5.
           super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
           super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl;
      cmMakefile::AddFunctionBlocker
                (status->Makefile,
                 (unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> *)
                 &local_190);
      if ((_Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
          local_190._M_t.
          super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
          super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl != (cmFunctionBlocker *)0x0
         ) {
        (**(code **)(*(long *)local_190._M_t.
                              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                              .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 8))
                  ();
      }
      local_190._M_t.
      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
      super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
           (tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
           (_Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)0x0;
    }
    bVar3 = true;
  }
  else {
    _Stack_120._M_unused._M_object = ((_Alloc_hider *)local_158._0_8_)->_M_p;
    local_138._16_8_ = *(size_type *)(local_158._0_8_ + 8);
    local_138._0_8_ = (ActionMap *)0x22;
    local_138._8_8_ = "called with unsupported argument \"";
    p_Stack_110 = (_Manager_type)local_50;
    local_60._M_head_impl = (PolicyPushPop *)0x1;
    local_50[0] = '\"';
    _Stack_120._8_8_ = 1;
    views._M_len = 3;
    views._M_array = (iterator)local_138;
    local_58 = p_Stack_110;
    cmCatViews_abi_cxx11_((string *)local_178,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00376500:
    if ((ActionMap *)local_178._0_8_ != (ActionMap *)(local_178 + 0x10)) {
LAB_00376513:
      operator_delete((void *)local_178._0_8_,
                      (ulong)((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)&((pointer)local_178._16_8_)->first)->_M_impl).
                                     super__Vector_impl_data._M_start + 1));
    }
LAB_0037651b:
    cmSystemTools::s_FatalErrorOccurred = true;
    bVar3 = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  if (local_80 == '\x01') {
    local_80 = '\0';
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_98);
  }
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_158);
  return bVar3;
}

Assistant:

bool cmBlockCommand(std::vector<std::string> const& args,
                    cmExecutionStatus& status)
{
  struct Arguments : public ArgumentParser::ParseResult
  {
    cm::optional<ArgumentParser::NonEmpty<std::vector<std::string>>> ScopeFor;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Propagate;
  };
  static auto const parser = cmArgumentParser<Arguments>{}
                               .Bind("SCOPE_FOR"_s, &Arguments::ScopeFor)
                               .Bind("PROPAGATE"_s, &Arguments::Propagate);
  std::vector<std::string> unrecognizedArguments;
  auto parsedArgs = parser.Parse(args, &unrecognizedArguments);

  if (!unrecognizedArguments.empty()) {
    status.SetError(cmStrCat("called with unsupported argument \"",
                             unrecognizedArguments[0], '"'));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (parsedArgs.MaybeReportError(status.GetMakefile())) {
    cmSystemTools::SetFatalErrorOccurred();
    return true;
  }

  ScopeSet scopes;

  if (parsedArgs.ScopeFor) {
    for (auto const& scope : *parsedArgs.ScopeFor) {
      if (scope == "VARIABLES"_s) {
        scopes.insert(ScopeType::VARIABLES);
        continue;
      }
      if (scope == "POLICIES"_s) {
        scopes.insert(ScopeType::POLICIES);
        continue;
      }
      status.SetError(cmStrCat("SCOPE_FOR unsupported scope \"", scope, '"'));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
  } else {
    scopes = { ScopeType::VARIABLES, ScopeType::POLICIES };
  }
  if (!scopes.contains(ScopeType::VARIABLES) &&
      !parsedArgs.Propagate.empty()) {
    status.SetError(
      "PROPAGATE cannot be specified without a new scope for VARIABLES");
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  // create a function blocker
  auto fb = cm::make_unique<cmBlockFunctionBlocker>(
    &status.GetMakefile(), scopes, parsedArgs.Propagate);
  status.GetMakefile().AddFunctionBlocker(std::move(fb));

  return true;
}